

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void fmt::v9::detail::report_error(format_func func,int error_code,char *message)

{
  size_t sVar1;
  memory_buffer full_message;
  buffer<char> local_228;
  char local_208 [504];
  
  local_228.size_ = 0;
  local_228._vptr_buffer = (_func_int **)&PTR_grow_002d06b8;
  local_228.capacity_ = 500;
  local_228.ptr_ = local_208;
  (*func)(&local_228,error_code,message);
  sVar1 = fwrite(local_228.ptr_,local_228.size_,1,_stderr);
  if (sVar1 != 0) {
    fputc(10,_stderr);
  }
  if (local_228.ptr_ != local_208) {
    operator_delete(local_228.ptr_,local_228.capacity_);
  }
  return;
}

Assistant:

FMT_FUNC void report_error(format_func func, int error_code,
                           const char* message) noexcept {
  memory_buffer full_message;
  func(full_message, error_code, message);
  // Don't use fwrite_fully because the latter may throw.
  if (std::fwrite(full_message.data(), full_message.size(), 1, stderr) > 0)
    std::fputc('\n', stderr);
}